

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * cmTargetPropertyComputer::GetSources<cmTarget>
                 (cmTarget *tgt,cmMessenger *messenger,cmListFileBacktrace *context)

{
  cmTargetInternals *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  size_type sVar5;
  cmSourceFile *this;
  cmSourceFileLocation *pcVar6;
  ostream *poVar7;
  PolicyID id;
  pointer pbVar8;
  _Alloc_hider _Var9;
  char *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_388;
  string *local_368;
  cmMessenger *local_360;
  pointer local_358;
  string *local_350;
  cmTarget *local_348;
  string objLibName;
  ostringstream e;
  long local_318;
  ostringstream ss;
  
  pcVar1 = (tgt->Internal).Pointer;
  pbVar8 = (pcVar1->SourceEntries).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_358 = (pcVar1->SourceEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_358 == pbVar8) {
    _Var9._M_p = (pointer)0x0;
  }
  else {
    local_360 = messenger;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    local_368 = (string *)&tgt->Name;
    pcVar10 = "";
    local_348 = tgt;
    while (pbVar8 != local_358) {
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_350 = pbVar8;
      cmSystemTools::ExpandListArgument(pbVar8,&files,false);
      for (pbVar8 = files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                          (pbVar8,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((bVar2) && ((pbVar8->_M_dataplus)._M_p[pbVar8->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&objLibName,(ulong)pbVar8);
          sVar5 = cmGeneratorExpression::Find(&objLibName);
          if (sVar5 == 0xffffffffffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            local_388.field_2._M_allocated_capacity = (context->Bottom).Position.Position;
            local_388._M_dataplus._M_p = (pointer)(context->Bottom).State;
            local_388._M_string_length = (size_type)(context->Bottom).Position.Tree;
            PVar3 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)&local_388,CMP0051);
            if (PVar3 - NEW < 3) {
              std::operator<<((ostream *)&ss,pcVar10);
              std::operator<<((ostream *)&ss,(string *)pbVar8);
              pcVar10 = ";";
            }
            else if (PVar3 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_388,(cmPolicies *)0x33,id);
              poVar7 = std::operator<<((ostream *)&e,(string *)&local_388);
              std::operator<<(poVar7,"\n");
              std::__cxx11::string::~string((string *)&local_388);
              poVar7 = std::operator<<((ostream *)&e,"Target \"");
              poVar7 = std::operator<<(poVar7,local_368);
              std::operator<<(poVar7,
                              "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                             );
              std::__cxx11::stringbuf::str();
              cmMessenger::IssueMessage(local_360,AUTHOR_WARNING,&local_388,context);
              std::__cxx11::string::~string((string *)&local_388);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          else {
            std::operator<<((ostream *)&ss,pcVar10);
            std::operator<<((ostream *)&ss,(string *)pbVar8);
            pcVar10 = ";";
          }
          std::__cxx11::string::~string((string *)&objLibName);
        }
        else {
          sVar5 = cmGeneratorExpression::Find(pbVar8);
          if (sVar5 == 0xffffffffffffffff) {
            std::operator<<((ostream *)&ss,pcVar10);
            std::operator<<((ostream *)&ss,(string *)pbVar8);
            pcVar10 = ";";
          }
          else {
            this = cmMakefile::GetOrCreateSource(local_348->Makefile,pbVar8,false);
            pcVar6 = cmSourceFile::GetLocation(this);
            std::__cxx11::string::string((string *)&e,(string *)&pcVar6->Directory);
            if (local_318 != 0) {
              std::__cxx11::string::append((char *)&e);
            }
            std::__cxx11::string::append((string *)&e);
            std::operator<<((ostream *)&ss,pcVar10);
            std::operator<<((ostream *)&ss,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            pcVar10 = ";";
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
      pbVar8 = local_350 + 1;
    }
    if (GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                                   ::srcs_abi_cxx11_);
      if (iVar4 != 0) {
        GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                       ::srcs_abi_cxx11_.field_2;
        GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_._M_string_length = 0;
        GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                      ::srcs_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)
                             ::srcs_abi_cxx11_);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)
               &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                srcs_abi_cxx11_,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    _Var9 = GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
            srcs_abi_cxx11_._M_dataplus;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  return _Var9._M_p;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return CM_NULLPTR;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = entries.begin();
       i != entries.end(); ++i) {
    std::string const& entry = *i;

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator li = files.begin();
         li != files.end(); ++li) {
      if (cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>') {
        std::string objLibName = li->substr(17, li->size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << *li;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        cmake::MessageType messageType = cmake::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains "
               "$<TARGET_OBJECTS> generator expression in its sources "
               "list.  "
               "This content was not previously part of the SOURCES "
               "property "
               "when that property was read at configure time.  Code "
               "reading "
               "that property needs to be adapted to ignore the generator "
               "expression using the string(GENEX_STRIP) command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << *li;
        }
      } else if (cmGeneratorExpression::Find(*li) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << *li;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(*li);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}